

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264StreamReader.cpp
# Opt level: O1

int __thiscall
H264StreamReader::getIdrPrevFrames(H264StreamReader *this,uint8_t *buff,uint8_t *bufEnd)

{
  bool bVar1;
  int iVar2;
  byte *buff_00;
  bool bVar3;
  int unaff_R14D;
  bool bVar4;
  bool bVar5;
  SliceUnit slice;
  int local_c4;
  SliceUnit local_b0;
  
  buff_00 = NALUnit::findNextNAL
                      (buff + 4,(this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd);
  bVar4 = buff_00 < (this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd;
  if (bVar4) {
    local_c4 = 0;
    do {
      SliceUnit::SliceUnit(&local_b0);
      bVar3 = true;
      if (((*buff_00 & 0x1f) - 1 < 5) || ((*buff_00 & 0x1f) == 0x14)) {
        iVar2 = deserializeSliceHeader(this,&local_b0,buff_00,bufEnd);
        if (iVar2 == 0) {
          bVar1 = SliceUnit::isIDR(&local_b0);
          bVar5 = local_b0.first_mb_in_slice != 0;
          iVar2 = unaff_R14D;
          if (!bVar5 && bVar1) {
            iVar2 = 0;
          }
          if (bVar5 || bVar1) {
            bVar3 = bVar5 || !bVar1;
            unaff_R14D = iVar2;
          }
          else if (1 << ((char)(local_b0.sps)->log2_max_pic_order_cnt_lsb - 1U & 0x1f) <
                   (int)(uint)local_b0.pic_order_cnt_lsb) {
            local_c4 = local_c4 + (uint)(local_b0.bottom_field_flag == 0);
          }
          else {
            bVar3 = false;
            unaff_R14D = local_c4;
          }
        }
        else if ((iVar2 == -10) && ((this->super_MPEGStreamReader).m_eof == false)) {
          unaff_R14D = -1;
          bVar3 = false;
        }
        else {
          bVar3 = false;
          unaff_R14D = 0;
        }
      }
      local_b0.super_NALUnit._vptr_NALUnit = (_func_int **)&PTR__NALUnit_00242058;
      if (local_b0.super_NALUnit.m_nalBuffer != (uint8_t *)0x0) {
        operator_delete__(local_b0.super_NALUnit.m_nalBuffer);
      }
      if (!bVar3) break;
      buff_00 = NALUnit::findNextNAL
                          (buff_00,(this->super_MPEGStreamReader).super_AbstractStreamReader.
                                   m_bufEnd);
      bVar4 = buff_00 < (this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd;
    } while (bVar4);
  }
  else {
    local_c4 = 0;
  }
  iVar2 = -1;
  if (((this->super_MPEGStreamReader).m_eof & 1U) != 0) {
    iVar2 = local_c4;
  }
  if (bVar4) {
    iVar2 = unaff_R14D;
  }
  return iVar2;
}

Assistant:

int H264StreamReader::getIdrPrevFrames(uint8_t *buff, const uint8_t *bufEnd)
{
    int prevPicCnt = 0;
    int deserializeRez;
    for (uint8_t *nal = NALUnit::findNextNAL(buff + 4, m_bufEnd); nal < m_bufEnd;
         nal = NALUnit::findNextNAL(nal, m_bufEnd))
    {
        SliceUnit slice;

        int MaxPicOrderCntLsbHalf;
        switch (static_cast<NALUnit::NALType>(*nal & 0x1f))
        {
        case NALUnit::NALType::nuSliceIDR:
        case NALUnit::NALType::nuSliceNonIDR:
        case NALUnit::NALType::nuSliceA:
        case NALUnit::NALType::nuSliceB:
        case NALUnit::NALType::nuSliceC:
        case NALUnit::NALType::nuSliceExt:
            deserializeRez = deserializeSliceHeader(slice, nal, bufEnd);
            if (deserializeRez == NOT_ENOUGH_BUFFER && !m_eof)
                return -1;
            if (deserializeRez != 0)
                return 0;
            if (slice.isIDR() && slice.first_mb_in_slice == 0)
                return 0;
            if (slice.first_mb_in_slice != 0)
                break;
            MaxPicOrderCntLsbHalf = 1 << (slice.getSPS()->log2_max_pic_order_cnt_lsb - 1);
            if (slice.pic_order_cnt_lsb > MaxPicOrderCntLsbHalf)
            {
                if (slice.bottom_field_flag == 0)
                    prevPicCnt++;
            }
            else
                return prevPicCnt;
            break;
        default:
            break;
        }
    }
    if (m_eof)
        return prevPicCnt;
    return -1;
}